

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

ListNode * list_free(ListNode *head,CleanupListValue cleanup_value,void *cleanup_value_data)

{
  int iVar1;
  
  if (head == (ListNode *)0x0) {
    cm_print_error("%s\n","head");
    _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O1/_deps/cmocka-src/src/cmocka.c"
          ,0x298);
  }
  while (iVar1 = list_empty(head), iVar1 == 0) {
    list_remove_free(head->next,cleanup_value,cleanup_value_data);
  }
  return head;
}

Assistant:

static ListNode* list_free(
        ListNode * const head, const CleanupListValue cleanup_value,
        void * const cleanup_value_data) {
    assert_non_null(head);
    while (!list_empty(head)) {
        list_remove_free(head->next, cleanup_value, cleanup_value_data);
    }
    return head;
}